

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O3

void floats(void)

{
  rtosc_cmp_options very_tolerant;
  
  r[0].type = 'f';
  l[0].type = 'f';
  l[0].val.i = 0x3f800000;
  r[0].val.i = -0x40800000;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"1.0f","-1.0f",0x6b);
  very_tolerant.float_tolerance = 2.0;
  cmp_1(2,l,r,1,1,&very_tolerant,"1.0f","-1.0f (2.0 tolerance)",0x70);
  cmp_1(2,r,l,1,1,&very_tolerant,"-1.0f","1.0f (2.0 tolerance)",0x72);
  return;
}

Assistant:

void floats()
{
    l[0].type = r[0].type = 'f';
    l[0].val.f = 1.0f;
    r[0].val.f = -1.0f;

    cmp_gt(l, r, 1, 1, NULL, "1.0f", "-1.0f", __LINE__);

    rtosc_cmp_options very_tolerant = { 2.0 };

    cmp_1(eq, l, r, 1, 1, &very_tolerant,
          "1.0f", "-1.0f (2.0 tolerance)", __LINE__);
    cmp_1(eq, r, l, 1, 1, &very_tolerant,
          "-1.0f", "1.0f (2.0 tolerance)", __LINE__);
}